

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

void __thiscall DNSResolve::Close(DNSResolve *this)

{
  Log *pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  DNSResolve *local_10;
  DNSResolve *this_local;
  
  local_10 = this;
  pLVar1 = Log::GetInstance();
  pLVar1 = Log::operator<<(pLVar1,white);
  Log::FormatTime_abi_cxx11_();
  pLVar1 = Log::operator<<(pLVar1,&local_30);
  pLVar1 = Log::operator<<(pLVar1,(char (*) [9])" [info] ");
  Log::operator<<(pLVar1,(char (*) [18])"DNSResolve close\n");
  std::__cxx11::string::~string((string *)&local_30);
  this->is_closed_ = true;
  if (this->event_loop_ != (EventLoop *)0x0) {
    EventLoop::Remove(this->event_loop_,this->dns_socket_);
  }
  CloseSocket(this->dns_socket_);
  return;
}

Assistant:

void DNSResolve::Close()
{
    LOGI << "DNSResolve close\n";
    is_closed_ = true;
    if (event_loop_)
    {
        event_loop_->Remove(dns_socket_);
    }
    CloseSocket(dns_socket_);
}